

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::fixColumn(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *lp,int j,bool correctIdx)

{
  uint *puVar1;
  bool bVar2;
  fpclass_type fVar3;
  pointer pnVar4;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  long *plVar5;
  undefined1 auVar6 [8];
  __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  _Var7;
  undefined1 auVar8 [8];
  long lVar9;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar10;
  bool bVar11;
  int iVar12;
  long lVar13;
  cpp_dec_float<50U,_int,_void> *pcVar14;
  int *piVar15;
  bool *pbVar16;
  fpclass_type *pfVar17;
  FixVariablePS *this_02;
  undefined7 in_register_00000009;
  cpp_dec_float<50U,_int,_void> *pcVar18;
  long lVar19;
  long lVar20;
  long in_FS_OFFSET;
  Real eps;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lo;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  undefined1 local_4e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_4e0;
  uint local_4d8 [3];
  undefined3 uStack_4cb;
  uint local_4c8;
  undefined3 uStack_4c3;
  int local_4c0;
  bool local_4bc [4];
  long local_4b8 [2];
  undefined1 local_4a8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4a0;
  uint local_498 [3];
  undefined3 uStack_48b;
  uint local_488;
  undefined3 uStack_483;
  int local_480;
  bool local_47c [4];
  long local_478;
  Item *local_470;
  undefined1 local_468 [16];
  uint local_458 [3];
  undefined3 uStack_44b;
  uint local_448 [3];
  bool local_43c;
  undefined8 local_438;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_430;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_428;
  undefined4 local_420;
  int local_41c;
  element_type *local_418;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_410;
  uint local_408 [2];
  uint auStack_400 [2];
  uint local_3f8 [2];
  int local_3f0;
  bool local_3ec;
  undefined8 local_3e8;
  long local_3d8;
  undefined8 uStack_3d0;
  element_type *local_3c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_3c0;
  uint local_3b8 [2];
  uint auStack_3b0 [2];
  uint local_3a8 [2];
  int local_3a0;
  bool local_39c;
  fpclass_type local_398;
  int32_t iStack_394;
  cpp_dec_float<50U,_int,_void> local_388;
  shared_ptr<soplex::Tolerances> local_348;
  long local_338;
  undefined8 uStack_330;
  long local_320;
  uint local_318 [2];
  uint auStack_310 [2];
  uint local_308 [2];
  uint auStack_300 [2];
  uint local_2f8 [4];
  cpp_dec_float<50U,_int,_void> local_2e8;
  element_type *local_2a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_2a0;
  uint local_298 [2];
  undefined8 uStack_290;
  undefined8 local_288;
  element_type *local_278;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_270;
  uint local_268 [2];
  undefined8 uStack_260;
  undefined8 local_258;
  element_type *local_248;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_240;
  uint local_238 [2];
  undefined8 uStack_230;
  undefined8 local_228;
  element_type *local_218;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_210;
  uint local_208 [2];
  undefined8 uStack_200;
  undefined8 local_1f8;
  element_type *local_1e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1e0;
  uint local_1d8 [2];
  uint auStack_1d0 [2];
  uint local_1c8 [4];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b8;
  element_type *local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_170;
  uint local_168 [2];
  uint auStack_160 [2];
  uint local_158 [2];
  int local_150;
  bool local_14c;
  fpclass_type local_148;
  int32_t local_144;
  double local_138;
  undefined8 uStack_130;
  double local_128;
  undefined8 uStack_120;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_420 = (undefined4)CONCAT71(in_register_00000009,correctIdx);
  lVar19 = (long)j;
  pnVar4 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_320 = lVar19 * 0x38;
  local_3f8 = *(uint (*) [2])(pnVar4[lVar19].m_backend.data._M_elems + 8);
  local_418 = *(element_type **)&pnVar4[lVar19].m_backend.data;
  p_Stack_410 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 (pnVar4[lVar19].m_backend.data._M_elems + 2);
  puVar1 = pnVar4[lVar19].m_backend.data._M_elems + 4;
  local_408 = *(uint (*) [2])puVar1;
  auStack_400 = *(uint (*) [2])(puVar1 + 2);
  local_3f0 = pnVar4[lVar19].m_backend.exp;
  local_3ec = pnVar4[lVar19].m_backend.neg;
  local_398 = pnVar4[lVar19].m_backend.fpclass;
  iStack_394 = pnVar4[lVar19].m_backend.prec_elem;
  pnVar4 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_2f8._0_8_ = *(undefined8 *)(pnVar4[lVar19].m_backend.data._M_elems + 8);
  local_318 = pnVar4[lVar19].m_backend.data._M_elems[0];
  auStack_310 = *(uint (*) [2])(pnVar4[lVar19].m_backend.data._M_elems + 2);
  puVar1 = pnVar4[lVar19].m_backend.data._M_elems + 4;
  local_308 = *(uint (*) [2])puVar1;
  auStack_300 = *(uint (*) [2])(puVar1 + 2);
  iVar12 = pnVar4[lVar19].m_backend.exp;
  bVar2 = pnVar4[lVar19].m_backend.neg;
  fVar3 = pnVar4[lVar19].m_backend.fpclass;
  local_1b8.m_backend.prec_elem = pnVar4[lVar19].m_backend.prec_elem;
  local_470 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[lVar19].idx;
  local_3e8 = CONCAT44(iStack_394,local_398);
  local_3d8 = CONCAT44(local_3d8._4_4_,local_1b8.m_backend.prec_elem);
  this_00 = (this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_428 = this;
  local_41c = j;
  local_3c8 = local_418;
  p_Stack_3c0 = p_Stack_410;
  local_3b8 = local_408;
  auStack_3b0 = auStack_400;
  local_3a8 = local_3f8;
  local_3a0 = local_3f0;
  local_39c = local_3ec;
  local_1b8.m_backend.data._M_elems._0_8_ = local_318;
  local_1b8.m_backend.data._M_elems._8_8_ = auStack_310;
  local_1b8.m_backend.data._M_elems._16_8_ = local_308;
  local_1b8.m_backend.data._M_elems._24_8_ = auStack_300;
  local_1b8.m_backend.data._M_elems._32_8_ = local_2f8._0_8_;
  local_1b8.m_backend.exp = iVar12;
  local_1b8.m_backend.neg = bVar2;
  local_1b8.m_backend.fpclass = fVar3;
  local_178 = local_418;
  p_Stack_170 = p_Stack_410;
  local_168 = local_408;
  auStack_160 = auStack_400;
  local_158 = local_3f8;
  local_150 = local_3f0;
  local_14c = local_3ec;
  local_148 = local_398;
  local_144 = iStack_394;
  eps = Tolerances::epsilon(this_00);
  bVar11 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                     ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_178,&local_1b8,eps);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (bVar11) {
    local_468._8_4_ = auStack_310[0];
    local_468._12_4_ = auStack_310[1];
    local_468._0_4_ = local_318[0];
    local_468._4_4_ = local_318[1];
    local_458[0] = local_308[0];
    local_458[1] = local_308[1];
    stack0xfffffffffffffbb0 = auStack_300._0_5_;
    uStack_44b = auStack_300[1]._1_3_;
    local_448[0] = local_2f8[0];
    local_448[1] = local_2f8[1];
    local_438 = CONCAT44((int)local_3d8,fVar3);
    local_448[2] = iVar12;
    local_43c = bVar2;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
              ((cpp_dec_float<50U,_int,_void> *)local_468,
               (cpp_dec_float<50U,_int,_void> *)&local_3c8);
    local_478 = 0xa00000000;
    local_4a8 = (undefined1  [8])0x0;
    p_Stack_4a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_498[0] = 0;
    local_498[1] = 0;
    stack0xfffffffffffffb70 = 0;
    uStack_48b = 0;
    _local_488 = 0;
    uStack_483 = 0;
    local_480 = 0;
    local_47c[0] = false;
    local_4b8[0] = 0xa00000000;
    _local_4e8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  )ZEXT816(0);
    local_4d8[0] = 0;
    local_4d8[1] = 0;
    stack0xfffffffffffffb30 = 0;
    uStack_4cb = 0;
    _local_4c8 = 0;
    uStack_4c3 = 0;
    local_4c0 = 0;
    local_4bc[0] = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_4e8,2.0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((cpp_dec_float<50U,_int,_void> *)local_4a8,(cpp_dec_float<50U,_int,_void> *)local_468
               ,(cpp_dec_float<50U,_int,_void> *)local_4e8);
    auStack_400[1]._1_3_ = uStack_48b;
    auStack_400._0_5_ = stack0xfffffffffffffb70;
    local_418 = (element_type *)local_4a8;
    p_Stack_410 = p_Stack_4a0;
    local_408[0] = local_498[0];
    local_408[1] = local_498[1];
    local_3f8[1]._1_3_ = uStack_483;
    local_3f8._0_5_ = _local_488;
    local_3f0 = local_480;
    local_3ec = local_47c[0];
    local_3e8 = local_478;
  }
  bVar2 = local_39c;
  iVar12 = local_3a0;
  local_1c8[0] = local_3a8[0];
  local_1c8[1] = local_3a8[1];
  local_1d8[0] = local_3b8[0];
  local_1d8[1] = local_3b8[1];
  auStack_1d0[0] = auStack_3b0[0];
  auStack_1d0[1] = auStack_3b0[1];
  local_1e8 = local_3c8;
  p_Stack_1e0 = p_Stack_3c0;
  lVar19 = CONCAT44(iStack_394,local_398);
  uStack_3d0 = 0;
  local_3d8 = lVar19;
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_68,local_428);
  _local_4c8 = (undefined5)local_1c8._0_8_;
  uStack_4c3 = SUB83(local_1c8._0_8_,5);
  local_4d8[0] = local_1d8[0];
  local_4d8[1] = local_1d8[1];
  stack0xfffffffffffffb30 = auStack_1d0._0_5_;
  uStack_4cb = auStack_1d0[1]._1_3_;
  local_4e8 = (undefined1  [8])local_1e8;
  auVar6 = local_4e8;
  _Stack_4e0._M_pi = p_Stack_1e0;
  local_4c0 = iVar12;
  local_4bc[0] = bVar2;
  if ((bVar2 == true) &&
     (local_4e8._0_4_ = SUB84(local_1e8,0), local_4e8._0_4_ != 0 || (int)local_3d8 != 0)) {
    local_4bc[0] = false;
  }
  local_4b8[0] = lVar19;
  local_4e8 = auVar6;
  if (((((int)local_3d8 != 2) && (local_68.fpclass != cpp_dec_float_NaN)) &&
      (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          ((cpp_dec_float<50U,_int,_void> *)local_4e8,&local_68), 0 < iVar12)) &&
     (0 < (local_470->data).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused)) {
    local_128 = *(double *)(in_FS_OFFSET + -8);
    uStack_120 = 0;
    local_138 = -local_128;
    uStack_130 = 0x8000000000000000;
    lVar19 = 0;
    lVar20 = 0;
    local_430 = lp;
    do {
      lVar13 = (long)*(int *)((long)(&((local_470->data).
                                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .m_elem)->val + 1) + lVar19);
      pcVar18 = &(lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar13].m_backend;
      local_3d8 = lVar13;
      ::soplex::infinity::__tls_init();
      local_4b8[0] = 0xa00000000;
      local_4e8 = (undefined1  [8])0x0;
      _Stack_4e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_4d8[0] = 0;
      local_4d8[1] = 0;
      stack0xfffffffffffffb30 = 0;
      uStack_4cb = 0;
      _local_4c8 = 0;
      uStack_4c3 = 0;
      local_4c0 = 0;
      local_4bc[0] = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)local_4e8,local_128);
      if (((pcVar18->fpclass != cpp_dec_float_NaN) &&
          ((fpclass_type)local_4b8[0] != cpp_dec_float_NaN)) &&
         (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (pcVar18,(cpp_dec_float<50U,_int,_void> *)local_4e8), iVar12 < 0)) {
        pcVar14 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)(((local_470->data).
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .m_elem)->val).m_backend.data._M_elems + lVar19);
        local_438 = 0xa00000000;
        local_468 = (undefined1  [16])0x0;
        local_458[0] = 0;
        local_458[1] = 0;
        stack0xfffffffffffffbb0 = 0;
        uStack_44b = 0;
        local_448[0] = 0;
        local_448[1] = 0;
        local_448[2] = 0;
        local_43c = false;
        pcVar18 = (cpp_dec_float<50U,_int,_void> *)&local_418;
        if (pcVar14 != (cpp_dec_float<50U,_int,_void> *)local_468) {
          local_448[0] = local_3f8[0];
          local_448[1] = local_3f8[1];
          local_458[0] = local_408[0];
          local_458[1] = local_408[1];
          stack0xfffffffffffffbb0 = auStack_400._0_5_;
          uStack_44b = auStack_400[1]._1_3_;
          local_468._8_8_ = p_Stack_410;
          local_468._0_8_ = local_418;
          local_448[2] = local_3f0;
          local_43c = local_3ec;
          local_438 = local_3e8;
          pcVar18 = pcVar14;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  ((cpp_dec_float<50U,_int,_void> *)local_468,pcVar18);
        pnVar4 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_1f8 = *(undefined8 *)(pnVar4[lVar13].m_backend.data._M_elems + 8);
        local_218 = *(element_type **)&pnVar4[lVar13].m_backend.data;
        p_Stack_210 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                       (pnVar4[lVar13].m_backend.data._M_elems + 2);
        puVar1 = pnVar4[lVar13].m_backend.data._M_elems + 4;
        local_208 = *(uint (*) [2])puVar1;
        uStack_200 = *(undefined8 *)(puVar1 + 2);
        local_4bc[0] = pnVar4[lVar13].m_backend.neg;
        local_4b8[0]._0_4_ = pnVar4[lVar13].m_backend.fpclass;
        local_4b8[0]._4_4_ = pnVar4[lVar13].m_backend.prec_elem;
        _local_4c8 = (undefined5)local_1f8;
        uStack_4c3 = (undefined3)((ulong)local_1f8 >> 0x28);
        local_4d8[0] = local_208[0];
        local_4d8[1] = local_208[1];
        stack0xfffffffffffffb30 = (undefined5)uStack_200;
        uStack_4cb = (undefined3)((ulong)uStack_200 >> 0x28);
        local_4e8 = (undefined1  [8])local_218;
        auVar6 = local_4e8;
        _Stack_4e0._M_pi = p_Stack_210;
        local_4c0 = pnVar4[lVar13].m_backend.exp;
        if ((local_4bc[0] == true) &&
           (local_4e8._0_4_ = SUB84(local_218,0),
           local_4e8._0_4_ != 0 || (fpclass_type)local_4b8[0] != cpp_dec_float_finite)) {
          local_4bc[0] = false;
        }
        _local_488 = (undefined5)local_448._0_8_;
        uStack_483 = SUB83(local_448._0_8_,5);
        local_498[0] = local_458[0];
        local_498[1] = local_458[1];
        stack0xfffffffffffffb70 = stack0xfffffffffffffbb0;
        uStack_48b = uStack_44b;
        local_4a8 = (undefined1  [8])local_468._0_8_;
        auVar8 = local_4a8;
        p_Stack_4a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_468._8_8_;
        local_480 = local_448[2];
        local_47c[0] = local_43c;
        local_478 = local_438;
        if ((local_43c != false) &&
           (local_4a8._0_4_ = local_468._0_4_, local_4a8._0_4_ != 0 || (int)local_438 != 0)) {
          local_47c[0] = (bool)(local_43c ^ 1);
        }
        local_4a8 = auVar8;
        if ((int)local_438 == 2 || (fpclass_type)local_4b8[0] == cpp_dec_float_NaN) {
          bVar2 = false;
        }
        else {
          local_4e8 = auVar6;
          iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)local_4e8,
                              (cpp_dec_float<50U,_int,_void> *)local_4a8);
          bVar2 = 0 < iVar12;
        }
        pcVar18 = (cpp_dec_float<50U,_int,_void> *)local_4a8;
        if (bVar2) {
          pcVar18 = (cpp_dec_float<50U,_int,_void> *)local_4e8;
        }
        local_388.data._M_elems._32_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 8);
        local_388.data._M_elems._0_8_ = *(undefined8 *)(pcVar18->data)._M_elems;
        local_388.data._M_elems._8_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 2);
        local_388.data._M_elems._16_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 4);
        local_388.data._M_elems._24_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 6);
        piVar15 = &local_480;
        if (bVar2) {
          piVar15 = &local_4c0;
        }
        local_388.exp = *piVar15;
        pbVar16 = local_47c;
        if (bVar2) {
          pbVar16 = local_4bc;
        }
        local_388.neg = *pbVar16;
        pfVar17 = (fpclass_type *)&local_478;
        if (bVar2) {
          pfVar17 = (fpclass_type *)local_4b8;
        }
        local_388.fpclass = *pfVar17;
        plVar5 = &local_478;
        if (bVar2) {
          plVar5 = local_4b8;
        }
        local_388.prec_elem = *(int32_t *)((long)plVar5 + 4);
        if (local_388.fpclass != cpp_dec_float_NaN) {
          local_4b8[0] = 0xa00000000;
          local_4e8 = (undefined1  [8])0x0;
          _Stack_4e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_4d8[0] = 0;
          local_4d8[1] = 0;
          stack0xfffffffffffffb30 = 0;
          uStack_4cb = 0;
          _local_4c8 = 0;
          uStack_4c3 = 0;
          local_4c0 = 0;
          local_4bc[0] = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_4e8,1.0);
          iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_388,(cpp_dec_float<50U,_int,_void> *)local_4e8);
          if (iVar12 < 0) {
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_388,1.0);
          }
        }
        local_4b8[0] = 0xa00000000;
        _local_4e8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_4d8[0] = 0;
        local_4d8[1] = 0;
        stack0xfffffffffffffb30 = 0;
        uStack_4cb = 0;
        _local_4c8 = 0;
        uStack_4c3 = 0;
        local_4c0 = 0;
        local_4bc[0] = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)local_4e8,
                   &(lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar13].m_backend,&local_388);
        local_2e8.fpclass = cpp_dec_float_finite;
        local_2e8.prec_elem = 10;
        local_2e8.data._M_elems[0] = 0;
        local_2e8.data._M_elems[1] = 0;
        local_2e8.data._M_elems[2] = 0;
        local_2e8.data._M_elems[3] = 0;
        local_2e8.data._M_elems[4] = 0;
        local_2e8.data._M_elems[5] = 0;
        local_2e8.data._M_elems._24_5_ = 0;
        local_2e8.data._M_elems[7]._1_3_ = 0;
        local_2e8.data._M_elems._32_5_ = 0;
        local_2e8._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_2e8,(cpp_dec_float<50U,_int,_void> *)local_468,&local_388);
        _local_488 = _local_4c8;
        uStack_483 = uStack_4c3;
        local_498[0] = local_4d8[0];
        local_498[1] = local_4d8[1];
        stack0xfffffffffffffb70 = stack0xfffffffffffffb30;
        uStack_48b = uStack_4cb;
        local_4a8 = local_4e8;
        p_Stack_4a0 = _Stack_4e0._M_pi;
        local_480 = local_4c0;
        local_47c[0] = local_4bc[0];
        local_478 = local_4b8[0];
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  ((cpp_dec_float<50U,_int,_void> *)local_4a8,&local_2e8);
        lVar9 = local_478;
        bVar2 = local_47c[0];
        iVar12 = local_480;
        uStack_230 = CONCAT35(uStack_48b,stack0xfffffffffffffb70);
        local_248 = (element_type *)local_4a8;
        _Stack_240._M_pi = p_Stack_4a0;
        local_238[0] = local_498[0];
        local_238[1] = local_498[1];
        local_228 = CONCAT35(uStack_483,_local_488);
        local_338 = local_478;
        uStack_330 = 0;
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_a0,local_428);
        _local_4c8 = (undefined5)local_228;
        uStack_4c3 = (undefined3)((ulong)local_228 >> 0x28);
        local_4d8[0] = local_238[0];
        local_4d8[1] = local_238[1];
        stack0xfffffffffffffb30 = (undefined5)uStack_230;
        uStack_4cb = (undefined3)((ulong)uStack_230 >> 0x28);
        _Stack_4e0._M_pi = _Stack_240._M_pi;
        local_4e8 = (undefined1  [8])local_248;
        _Var7 = _local_4e8;
        local_4c0 = iVar12;
        local_4bc[0] = bVar2;
        local_4b8[0] = lVar9;
        if ((bVar2 == true) &&
           (local_4e8._0_4_ = SUB84(local_248,0), local_4e8._0_4_ != 0 || (int)local_338 != 0)) {
          local_4bc[0] = false;
        }
        _local_4e8 = _Var7;
        if (((int)local_338 == 2) || (local_a0.fpclass == cpp_dec_float_NaN)) {
LAB_0030410f:
          lp = local_430;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    ((cpp_dec_float<50U,_int,_void> *)local_4a8,&local_388);
        }
        else {
          iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)local_4e8,&local_a0);
          lp = local_430;
          if (0 < iVar12) goto LAB_0030410f;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_4a8,0.0);
        }
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x36])(lp,local_3d8,local_4a8,0);
      }
      pcVar18 = &(lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar13].m_backend;
      ::soplex::infinity::__tls_init();
      local_4b8[0] = 0xa00000000;
      local_4e8 = (undefined1  [8])0x0;
      _Stack_4e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_4d8[0] = 0;
      local_4d8[1] = 0;
      stack0xfffffffffffffb30 = 0;
      uStack_4cb = 0;
      _local_4c8 = 0;
      uStack_4c3 = 0;
      local_4c0 = 0;
      local_4bc[0] = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)local_4e8,local_138);
      if ((pcVar18->fpclass != cpp_dec_float_NaN) &&
         ((fpclass_type)local_4b8[0] != cpp_dec_float_NaN)) {
        iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (pcVar18,(cpp_dec_float<50U,_int,_void> *)local_4e8);
        if (0 < iVar12) {
          pcVar14 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)(((local_470->data).
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .m_elem)->val).m_backend.data._M_elems + lVar19);
          local_438 = 0xa00000000;
          local_468 = (undefined1  [16])0x0;
          local_458[0] = 0;
          local_458[1] = 0;
          stack0xfffffffffffffbb0 = 0;
          uStack_44b = 0;
          local_448[0] = 0;
          local_448[1] = 0;
          local_448[2] = 0;
          local_43c = false;
          pcVar18 = (cpp_dec_float<50U,_int,_void> *)&local_418;
          if (pcVar14 != (cpp_dec_float<50U,_int,_void> *)local_468) {
            local_448[0] = local_3f8[0];
            local_448[1] = local_3f8[1];
            local_458[0] = local_408[0];
            local_458[1] = local_408[1];
            stack0xfffffffffffffbb0 = auStack_400._0_5_;
            uStack_44b = auStack_400[1]._1_3_;
            local_468._8_8_ = p_Stack_410;
            local_468._0_8_ = local_418;
            local_448[2] = local_3f0;
            local_43c = local_3ec;
            local_438 = local_3e8;
            pcVar18 = pcVar14;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    ((cpp_dec_float<50U,_int,_void> *)local_468,pcVar18);
          pnVar4 = (lp->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_258 = *(undefined8 *)(pnVar4[lVar13].m_backend.data._M_elems + 8);
          local_278 = *(element_type **)&pnVar4[lVar13].m_backend.data;
          p_Stack_270 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                         (pnVar4[lVar13].m_backend.data._M_elems + 2);
          puVar1 = pnVar4[lVar13].m_backend.data._M_elems + 4;
          local_268 = *(uint (*) [2])puVar1;
          uStack_260 = *(undefined8 *)(puVar1 + 2);
          local_4bc[0] = pnVar4[lVar13].m_backend.neg;
          local_4b8[0]._0_4_ = pnVar4[lVar13].m_backend.fpclass;
          local_4b8[0]._4_4_ = pnVar4[lVar13].m_backend.prec_elem;
          _local_4c8 = (undefined5)local_258;
          uStack_4c3 = (undefined3)((ulong)local_258 >> 0x28);
          local_4d8[0] = local_268[0];
          local_4d8[1] = local_268[1];
          stack0xfffffffffffffb30 = (undefined5)uStack_260;
          uStack_4cb = (undefined3)((ulong)uStack_260 >> 0x28);
          local_4e8 = (undefined1  [8])local_278;
          auVar6 = local_4e8;
          _Stack_4e0._M_pi = p_Stack_270;
          local_4c0 = pnVar4[lVar13].m_backend.exp;
          if ((local_4bc[0] == true) &&
             (local_4e8._0_4_ = SUB84(local_278,0),
             local_4e8._0_4_ != 0 || (fpclass_type)local_4b8[0] != cpp_dec_float_finite)) {
            local_4bc[0] = false;
          }
          _local_488 = (undefined5)local_448._0_8_;
          uStack_483 = SUB83(local_448._0_8_,5);
          local_498[0] = local_458[0];
          local_498[1] = local_458[1];
          stack0xfffffffffffffb70 = stack0xfffffffffffffbb0;
          uStack_48b = uStack_44b;
          local_4a8 = (undefined1  [8])local_468._0_8_;
          auVar8 = local_4a8;
          p_Stack_4a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_468._8_8_;
          local_480 = local_448[2];
          local_47c[0] = local_43c;
          local_478 = local_438;
          if ((local_43c != false) &&
             (local_4a8._0_4_ = local_468._0_4_, local_4a8._0_4_ != 0 || (int)local_438 != 0)) {
            local_47c[0] = (bool)(local_43c ^ 1);
          }
          local_4a8 = auVar8;
          if ((int)local_438 == 2 || (fpclass_type)local_4b8[0] == cpp_dec_float_NaN) {
            bVar2 = false;
          }
          else {
            local_4e8 = auVar6;
            iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_4e8,
                                (cpp_dec_float<50U,_int,_void> *)local_4a8);
            bVar2 = 0 < iVar12;
          }
          pcVar18 = (cpp_dec_float<50U,_int,_void> *)local_4a8;
          if (bVar2) {
            pcVar18 = (cpp_dec_float<50U,_int,_void> *)local_4e8;
          }
          local_388.data._M_elems._32_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 8);
          local_388.data._M_elems._0_8_ = *(undefined8 *)(pcVar18->data)._M_elems;
          local_388.data._M_elems._8_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 2);
          local_388.data._M_elems._16_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 4);
          local_388.data._M_elems._24_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 6);
          piVar15 = &local_480;
          if (bVar2) {
            piVar15 = &local_4c0;
          }
          local_388.exp = *piVar15;
          pbVar16 = local_47c;
          if (bVar2) {
            pbVar16 = local_4bc;
          }
          local_388.neg = *pbVar16;
          pfVar17 = (fpclass_type *)&local_478;
          if (bVar2) {
            pfVar17 = (fpclass_type *)local_4b8;
          }
          local_388.fpclass = *pfVar17;
          plVar5 = &local_478;
          if (bVar2) {
            plVar5 = local_4b8;
          }
          local_388.prec_elem = *(int32_t *)((long)plVar5 + 4);
          if (local_388.fpclass != cpp_dec_float_NaN) {
            local_4b8[0] = 0xa00000000;
            local_4e8 = (undefined1  [8])0x0;
            _Stack_4e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_4d8[0] = 0;
            local_4d8[1] = 0;
            stack0xfffffffffffffb30 = 0;
            uStack_4cb = 0;
            _local_4c8 = 0;
            uStack_4c3 = 0;
            local_4c0 = 0;
            local_4bc[0] = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_4e8,1.0);
            iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_388,(cpp_dec_float<50U,_int,_void> *)local_4e8);
            if (iVar12 < 0) {
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_388,1.0);
            }
          }
          local_4b8[0] = 0xa00000000;
          _local_4e8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        )ZEXT816(0);
          local_4d8[0] = 0;
          local_4d8[1] = 0;
          stack0xfffffffffffffb30 = 0;
          uStack_4cb = 0;
          _local_4c8 = 0;
          uStack_4c3 = 0;
          local_4c0 = 0;
          local_4bc[0] = false;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((cpp_dec_float<50U,_int,_void> *)local_4e8,
                     &(lp->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar13].m_backend,&local_388);
          local_2e8.fpclass = cpp_dec_float_finite;
          local_2e8.prec_elem = 10;
          local_2e8.data._M_elems[0] = 0;
          local_2e8.data._M_elems[1] = 0;
          local_2e8.data._M_elems[2] = 0;
          local_2e8.data._M_elems[3] = 0;
          local_2e8.data._M_elems[4] = 0;
          local_2e8.data._M_elems[5] = 0;
          local_2e8.data._M_elems._24_5_ = 0;
          local_2e8.data._M_elems[7]._1_3_ = 0;
          local_2e8.data._M_elems._32_5_ = 0;
          local_2e8._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_2e8,(cpp_dec_float<50U,_int,_void> *)local_468,&local_388);
          _local_488 = _local_4c8;
          uStack_483 = uStack_4c3;
          local_498[0] = local_4d8[0];
          local_498[1] = local_4d8[1];
          stack0xfffffffffffffb70 = stack0xfffffffffffffb30;
          uStack_48b = uStack_4cb;
          local_4a8 = local_4e8;
          p_Stack_4a0 = _Stack_4e0._M_pi;
          local_480 = local_4c0;
          local_47c[0] = local_4bc[0];
          local_478 = local_4b8[0];
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    ((cpp_dec_float<50U,_int,_void> *)local_4a8,&local_2e8);
          lVar13 = local_478;
          bVar2 = local_47c[0];
          iVar12 = local_480;
          uStack_290 = CONCAT35(uStack_48b,stack0xfffffffffffffb70);
          local_2a8 = (element_type *)local_4a8;
          p_Stack_2a0 = p_Stack_4a0;
          local_298[0] = local_498[0];
          local_298[1] = local_498[1];
          local_288 = CONCAT35(uStack_483,_local_488);
          local_338 = local_478;
          uStack_330 = 0;
          epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&local_d8,local_428);
          _local_4c8 = (undefined5)local_288;
          uStack_4c3 = (undefined3)((ulong)local_288 >> 0x28);
          local_4d8[0] = local_298[0];
          local_4d8[1] = local_298[1];
          stack0xfffffffffffffb30 = (undefined5)uStack_290;
          uStack_4cb = (undefined3)((ulong)uStack_290 >> 0x28);
          local_4e8 = (undefined1  [8])local_2a8;
          auVar6 = local_4e8;
          _Stack_4e0._M_pi = p_Stack_2a0;
          local_4c0 = iVar12;
          local_4bc[0] = bVar2;
          local_4b8[0] = lVar13;
          if ((bVar2 == true) &&
             (local_4e8._0_4_ = SUB84(local_2a8,0), local_4e8._0_4_ != 0 || (int)local_338 != 0)) {
            local_4bc[0] = false;
          }
          local_4e8 = auVar6;
          if (((int)local_338 == 2) || (local_d8.fpclass == cpp_dec_float_NaN)) {
LAB_003046b9:
            lp = local_430;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      ((cpp_dec_float<50U,_int,_void> *)local_4a8,&local_388);
          }
          else {
            iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_4e8,&local_d8);
            lp = local_430;
            if (0 < iVar12) goto LAB_003046b9;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_4a8,0.0);
          }
          (*(lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x33])(lp,local_3d8,local_4a8,0);
        }
      }
      lVar20 = lVar20 + 1;
      lVar19 = lVar19 + 0x3c;
    } while (lVar20 < (local_470->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  this_02 = (FixVariablePS *)operator_new(0x138);
  pSVar10 = local_428;
  pnVar4 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (uint *)((long)(pnVar4->m_backend).data._M_elems + local_320);
  local_118.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
  local_118.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)(pnVar4->m_backend).data._M_elems + local_320 + 0x10);
  local_118.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_118.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  local_118.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + local_320 + 0x20);
  local_118.m_backend.exp = *(int *)((long)(&(pnVar4->m_backend).data + 1) + local_320);
  local_118.m_backend.neg = *(bool *)((long)(&(pnVar4->m_backend).data + 1) + local_320 + 4U);
  local_118.m_backend._48_8_ =
       *(undefined8 *)((long)(&(pnVar4->m_backend).data + 1) + local_320 + 8U);
  local_348.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (local_428->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_348.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (local_428->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_348.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_348.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_348.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_348.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_348.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  FixVariablePS::FixVariablePS
            (this_02,lp,local_428,local_41c,&local_118,&local_348,SUB41(local_420,0));
  local_4e8 = (undefined1  [8])this_02;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixVariablePS*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_4e8 + 8),this_02);
  if (local_348.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_348.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::push_back(&(pSVar10->m_hist).data,(value_type *)local_4e8);
  if (_Stack_4e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_4e0._M_pi);
  }
  return;
}

Assistant:

void SPxMainSM<R>::fixColumn(SPxLPBase<R>& lp, int j, bool correctIdx)
{

   assert(EQrel(lp.lower(j), lp.upper(j), feastol()));

   R lo            = lp.lower(j);
   R up            = lp.upper(j);
   const SVectorBase<R>& col = lp.colVector(j);
   R mid           = lo;

   // use the center value between slightly different bounds to improve numerics
   if(NE(lo, up, this->tolerances()->epsilon()))
      mid = (up + lo) / 2.0;

   assert(lo < R(infinity) && lo > R(-infinity));
   assert(up < R(infinity) && up > R(-infinity));

   SPxOut::debug(this, "IMAISM66 fix variable x{}: lower={} upper={} to new value: {}\n", j, lo, up,
                 mid);

   if(isNotZero(lo, this->epsZero()))
   {
      for(int k = 0; k < col.size(); ++k)
      {
         int i = col.index(k);

         if(lp.rhs(i) < R(infinity))
         {
            R y     = mid * col.value(k);
            R scale = maxAbs(lp.rhs(i), y);

            if(scale < 1.0)
               scale = 1.0;

            R rhs = (lp.rhs(i) / scale) - (y / scale);

            if(isZero(rhs, this->epsZero()))
               rhs = 0.0;
            else
               rhs *= scale;

            SPxOut::debug(this, "IMAISM67 row {}: rhs={} ({}) aij={}\n", i, rhs, lp.rhs(i), col.value(k));

            lp.changeRhs(i, rhs);
         }

         if(lp.lhs(i) > R(-infinity))
         {
            R y     = mid * col.value(k);
            R scale = maxAbs(lp.lhs(i), y);

            if(scale < 1.0)
               scale = 1.0;

            R lhs = (lp.lhs(i) / scale) - (y / scale);

            if(isZero(lhs, this->epsZero()))
               lhs = 0.0;
            else
               lhs *= scale;

            SPxOut::debug(this, "IMAISM68 row {}: lhs={} ({}) aij={}\n", i, lhs, lp.lhs(i), col.value(k));

            lp.changeLhs(i, lhs);
         }

         assert(lp.lhs(i) <= lp.rhs(i) + feastol());
      }
   }

   std::shared_ptr<PostStep> ptr(new FixVariablePS(lp, *this, j, lp.lower(j), this->_tolerances,
                                 correctIdx));
   m_hist.append(ptr);
}